

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O3

Tuple4d * math::reflect(Tuple4d *in,Tuple4d *normal)

{
  double dVar1;
  Tuple4d *ret_2;
  int i;
  long lVar2;
  double total;
  double dVar3;
  Tuple4d ret;
  Tuple4d ret_1;
  
  ret.m_buffer[2] = 0.0;
  ret.m_buffer[3] = 0.0;
  ret.m_buffer[0] = 0.0;
  ret.m_buffer[1] = 0.0;
  lVar2 = 0;
  do {
    dVar3 = normal->m_buffer[lVar2];
    dVar1 = (normal->m_buffer + lVar2)[1];
    ret.m_buffer[lVar2] = dVar3 + dVar3;
    ret.m_buffer[lVar2 + 1] = dVar1 + dVar1;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  dVar3 = 0.0;
  lVar2 = 0;
  do {
    dVar3 = dVar3 + in->m_buffer[lVar2] * normal->m_buffer[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  ret_1.m_buffer[2] = 0.0;
  ret_1.m_buffer[3] = 0.0;
  ret_1.m_buffer[0] = 0.0;
  ret_1.m_buffer[1] = 0.0;
  lVar2 = 0;
  do {
    dVar1 = ret.m_buffer[lVar2 + 1];
    ret_1.m_buffer[lVar2] = ret.m_buffer[lVar2] * dVar3;
    ret_1.m_buffer[lVar2 + 1] = dVar1 * dVar3;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  ret_2->m_buffer[2] = 0.0;
  ret_2->m_buffer[3] = 0.0;
  ret_2->m_buffer[0] = 0.0;
  ret_2->m_buffer[1] = 0.0;
  lVar2 = 0;
  do {
    dVar3 = (in->m_buffer + lVar2)[1];
    dVar1 = ret_1.m_buffer[lVar2 + 1];
    ret_2->m_buffer[lVar2] = in->m_buffer[lVar2] - ret_1.m_buffer[lVar2];
    (ret_2->m_buffer + lVar2)[1] = dVar3 - dVar1;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  return ret_2;
}

Assistant:

math::Tuple4d math::reflect(const math::Tuple4d &in, const math::Tuple4d &normal)
{
    return in - normal * 2 * dot(in, normal);
}